

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O1

void put_gray_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  int *piVar1;
  JSAMPARRAY __dest;
  JSAMPARRAY *pppJVar2;
  
  if (*(int *)&dinfo[1].output_file == 0) {
    pppJVar2 = &dinfo[1].buffer;
  }
  else {
    pppJVar2 = (JSAMPARRAY *)
               (*cinfo->mem->access_virt_sarray)
                         ((j_common_ptr)cinfo,(jvirt_sarray_ptr)dinfo[1].put_pixel_rows,
                          *(JDIMENSION *)((long)&dinfo[1].calc_buffer_dimensions + 4),1,1);
    piVar1 = (int *)((long)&dinfo[1].calc_buffer_dimensions + 4);
    *piVar1 = *piVar1 + 1;
  }
  __dest = *pppJVar2;
  memcpy(__dest,*dinfo->buffer,(ulong)cinfo->output_width);
  if (0 < (long)*(int *)&dinfo[1].calc_buffer_dimensions) {
    memset((JSAMPROW)((long)__dest + (ulong)cinfo->output_width),0,
           (long)*(int *)&dinfo[1].calc_buffer_dimensions);
  }
  if (*(int *)&dinfo[1].output_file != 0) {
    return;
  }
  fwrite(dinfo[1].buffer,1,(ulong)*(uint *)((long)&dinfo[1].finish_output + 4),
         (FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_gray_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
              JDIMENSION rows_supplied)
/* used for grayscale OR quantized color output */
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  register JSAMPROW inptr;
  register char *outptr;

  inptr = dest->pub.buffer[0];
  outptr = dest->iobuffer;
  MEMCOPY(outptr, inptr, cinfo->output_width);
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}